

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::OutputFile::Data::Data(Data *this,int numThreads)

{
  _Rb_tree_header *p_Var1;
  pointer ppLVar2;
  pointer ppLVar3;
  ulong uVar4;
  size_t __n;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  value_type *__val;
  ulong uVar8;
  V2f local_38;
  
  local_38.x = 0.0;
  local_38.y = 0.0;
  Header::Header(&this->header,0x40,0x40,1.0,&local_38,1.0,INCREASING_Y,ZIP_COMPRESSION);
  p_Var1 = &(this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->offsetInLineBuffer).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->offsetInLineBuffer).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->offsetInLineBuffer).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lineBuffers).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lineBuffers).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->lineOffsetsPosition = 0;
  (this->lineBuffers).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->partNumber = -1;
  this->_streamData = (OutputStreamMutex *)0x0;
  uVar6 = 1;
  if (1 < numThreads * 2) {
    uVar6 = (ulong)(uint)(numThreads * 2);
  }
  this->_deleteStream = false;
  ppLVar3 = (this->lineBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar2 = (this->lineBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = (long)ppLVar2 - (long)ppLVar3 >> 3;
  uVar7 = uVar6 - uVar8;
  if (uVar6 < uVar8 || uVar7 == 0) {
    if ((uVar6 < uVar8) && (ppLVar3 = ppLVar3 + uVar6, ppLVar2 != ppLVar3)) {
      (this->lineBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppLVar3;
    }
  }
  else if ((ulong)((long)(this->lineBuffers).
                         super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar2 >> 3) <
           uVar7) {
    if ((uVar8 ^ 0xfffffffffffffff) < uVar7) {
      std::__throw_length_error("vector::_M_default_append");
    }
    uVar4 = uVar7;
    if (uVar7 < uVar8) {
      uVar4 = uVar8;
    }
    uVar5 = uVar4 + uVar8;
    if (0xffffffffffffffe < uVar5) {
      uVar5 = 0xfffffffffffffff;
    }
    if (CARRY8(uVar4,uVar8)) {
      uVar5 = 0xfffffffffffffff;
    }
    if (uVar5 == 0) {
      ppLVar3 = (pointer)0x0;
    }
    else {
      ppLVar3 = (pointer)operator_new(uVar5 * 8);
    }
    ppLVar3[uVar8] = (LineBuffer *)0x0;
    if (uVar7 != 1) {
      memset(ppLVar3 + uVar8 + 1,0,uVar7 * 8 - 8);
    }
    ppLVar2 = (this->lineBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __n = (long)(this->lineBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2;
    if (0 < (long)__n) {
      memmove(ppLVar3,ppLVar2,__n);
    }
    if (ppLVar2 != (pointer)0x0) {
      operator_delete(ppLVar2,(long)(this->lineBuffers).
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppLVar2);
    }
    (this->lineBuffers).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppLVar3;
    (this->lineBuffers).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppLVar3 + uVar6;
    (this->lineBuffers).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppLVar3 + uVar5;
  }
  else {
    *ppLVar2 = (LineBuffer *)0x0;
    ppLVar3 = ppLVar2 + 1;
    if (uVar7 != 1) {
      memset(ppLVar3,0,uVar7 * 8 - 8);
      ppLVar3 = ppLVar2 + uVar7;
    }
    (this->lineBuffers).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppLVar3;
  }
  return;
}

Assistant:

OutputFile::Data::Data (int numThreads):
    lineOffsetsPosition (0),
    partNumber (-1),
    _streamData(0),
    _deleteStream(false)
{
    //
    // We need at least one lineBuffer, but if threading is used,
    // to keep n threads busy we need 2*n lineBuffers.
    //

    lineBuffers.resize (max (1, 2 * numThreads));
}